

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.h
# Opt level: O2

void __thiscall slang::assert::AssertionException::~AssertionException(AssertionException *this)

{
  std::logic_error::~logic_error(&this->super_logic_error);
  operator_delete(this,0x10);
  return;
}

Assistant:

class SLANG_EXPORT AssertionException : public std::logic_error {
public:
    AssertionException(const std::string& message) : std::logic_error(message) {}
};

/// A handler that runs when an ASSERT condition fails; it will unconditionally
/// thrown an exception.
[[noreturn]] SLANG_EXPORT void assertFailed(const char* expr, const char* file, int line,
                                            const char* func);

}